

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void cdataBlockDebug(void *ctx,xmlChar *value,int len)

{
  xmllintState *lint;
  int len_local;
  xmlChar *value_local;
  void *ctx_local;
  
  *(int *)((long)ctx + 0x28) = *(int *)((long)ctx + 0x28) + 1;
  if (*(int *)((long)ctx + 0x3c) == 0) {
    fprintf(_stdout,"SAX.pcdata(%.20s, %d)\n",value,(ulong)(uint)len);
  }
  return;
}

Assistant:

static void
cdataBlockDebug(void *ctx, const xmlChar *value, int len)
{
    xmllintState *lint = ctx;

    lint->callbacks++;
    if (lint->noout)
	return;
    fprintf(stdout, "SAX.pcdata(%.20s, %d)\n",
	    (char *) value, len);
}